

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O2

void __thiscall script_tests::sign_invalid_miniscript::test_method(sign_invalid_miniscript *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  bool bVar3;
  iterator pvVar4;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  Span<const_unsigned_char> script;
  check_type cVar6;
  char *local_668;
  char *local_660;
  undefined8 local_658;
  char *local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  CMutableTransaction curr;
  CMutableTransaction prev;
  undefined1 local_5b8 [72];
  undefined1 local_570;
  undefined1 local_530 [8];
  element_type *peStack_528;
  shared_count local_520;
  uchar auStack_518 [8];
  undefined1 local_510 [24];
  int *piStack_4f8;
  TaprootBuilder builder;
  array<unsigned_char,_60UL> invalid_pubkey;
  SignatureData sig_data;
  FillableSigningProvider keystore;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_01158ee0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  sig_data.complete = false;
  sig_data.witness = false;
  p_Var1 = &sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header;
  sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  memset(&sig_data.scriptSig,0,0xb8);
  sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sig_data.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sig_data.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  sig_data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  sig_data.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  sig_data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  sig_data.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sig_data.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sig_data.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sig_data.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  sig_data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sig_data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  CMutableTransaction::CMutableTransaction(&prev);
  CMutableTransaction::CMutableTransaction(&curr);
  invalid_pubkey._M_elems[0x30] = 0x92;
  invalid_pubkey._M_elems[0x31] = 0x92;
  invalid_pubkey._M_elems[0x32] = 0x92;
  invalid_pubkey._M_elems[0x33] = 0x92;
  invalid_pubkey._M_elems[0x34] = 0x92;
  invalid_pubkey._M_elems[0x35] = 'k';
  invalid_pubkey._M_elems[0x36] = '\0';
  invalid_pubkey._M_elems[0x37] = 'l';
  invalid_pubkey._M_elems[0x38] = 0x9b;
  invalid_pubkey._M_elems[0x39] = 0x9b;
  invalid_pubkey._M_elems[0x3a] = 0x92;
  invalid_pubkey._M_elems[0x3b] = 0x92;
  builtin_memcpy(invalid_pubkey._M_elems + 0x20,"\x1e\x1e\x1e\x1e\x19",6);
  invalid_pubkey._M_elems[0x26] = '\0';
  invalid_pubkey._M_elems[0x27] = '\0';
  invalid_pubkey._M_elems[0x28] = '\0';
  invalid_pubkey._M_elems[0x29] = '\0';
  invalid_pubkey._M_elems[0x2a] = '\0';
  invalid_pubkey._M_elems[0x2b] = '\0';
  invalid_pubkey._M_elems[0x2c] = '\0';
  invalid_pubkey._M_elems[0x2d] = '\0';
  invalid_pubkey._M_elems[0x2e] = 0xb1;
  invalid_pubkey._M_elems[0x2f] = 0x92;
  invalid_pubkey._M_elems[0x10] = '\0';
  invalid_pubkey._M_elems[0x11] = '\0';
  invalid_pubkey._M_elems[0x12] = '\x02';
  invalid_pubkey._M_elems[0x13] = '\x1e';
  invalid_pubkey._M_elems[0x14] = '\x1e';
  invalid_pubkey._M_elems[0x15] = '7';
  invalid_pubkey._M_elems[0x16] = '7';
  invalid_pubkey._M_elems[0x17] = '7';
  invalid_pubkey._M_elems[0x18] = '!';
  invalid_pubkey._M_elems[0x19] = '6';
  invalid_pubkey._M_elems[0x1a] = '\x18';
  invalid_pubkey._M_elems[0x1b] = '\x18';
  invalid_pubkey._M_elems[0x1c] = '\x18';
  invalid_pubkey._M_elems[0x1d] = '\x18';
  invalid_pubkey._M_elems[0x1e] = '\x18';
  invalid_pubkey._M_elems[0x1f] = '\x18';
  invalid_pubkey._M_elems[0] = '\x17';
  invalid_pubkey._M_elems[1] = '=';
  invalid_pubkey._M_elems[2] = '6';
  invalid_pubkey._M_elems[3] = 200;
  invalid_pubkey._M_elems[4] = 0xc9;
  invalid_pubkey._M_elems[5] = 0xc9;
  invalid_pubkey._M_elems[6] = 0xc9;
  invalid_pubkey._M_elems[7] = 0xff;
  invalid_pubkey._M_elems[8] = 0xff;
  invalid_pubkey._M_elems[9] = 0xff;
  invalid_pubkey._M_elems[10] = 0xff;
  invalid_pubkey._M_elems[0xb] = 0xff;
  invalid_pubkey._M_elems[0xc] = 0xff;
  invalid_pubkey._M_elems[0xd] = '\x02';
  invalid_pubkey._M_elems[0xe] = '\0';
  invalid_pubkey._M_elems[0xf] = '\0';
  builder.m_valid = true;
  builder.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  builder.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  pvVar5 = &DAT_00000001;
  pvVar4 = (iterator)0xc0;
  script.m_size = 0x3c;
  script.m_data = invalid_pubkey._M_elems;
  TaprootBuilder::Add(&builder,0,script,0xc0,true);
  TaprootBuilder::Finalize(&builder,&XOnlyPubKey::NUMS_H);
  local_658 = (char *)((ulong)local_658._4_4_ << 0x20);
  TaprootBuilder::GetOutput((WitnessV1Taproot *)local_530,&builder);
  local_5b8._16_8_ = local_520.pi_;
  local_5b8[0x18] = auStack_518[0];
  local_5b8[0x19] = auStack_518[1];
  local_5b8[0x1a] = auStack_518[2];
  local_5b8[0x1b] = auStack_518[3];
  local_5b8[0x1c] = auStack_518[4];
  local_5b8[0x1d] = auStack_518[5];
  local_5b8[0x1e] = auStack_518[6];
  local_5b8[0x1f] = auStack_518[7];
  local_5b8._8_8_ = peStack_528;
  local_570 = 6;
  GetScriptForDestination((CScript *)local_510,(CTxDestination *)local_5b8);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&prev.vout,(int *)&local_658,
             (CScript *)local_510);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_510);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_5b8);
  CMutableTransaction::GetHash((Txid *)local_510,&prev);
  local_5b8._16_8_ = local_510._16_8_;
  local_5b8._24_8_ = piStack_4f8;
  local_5b8._0_8_ = local_510._0_8_;
  local_5b8._32_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (&curr.vin,(COutPoint *)local_5b8);
  TaprootBuilder::GetSpendData((TaprootSpendData *)local_5b8,&builder);
  TaprootSpendData::operator=(&sig_data.tr_spenddata,(TaprootSpendData *)local_5b8);
  std::
  _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
               *)(local_5b8 + 0x40));
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_630 = "";
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x501;
  file.m_begin = (iterator)&local_638;
  msg.m_end = pvVar5;
  msg.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_648,msg);
  CTransaction::CTransaction((CTransaction *)local_5b8,&prev);
  bVar3 = SignSignature(&keystore.super_SigningProvider,(CTransaction *)local_5b8,&curr,0,1,
                        &sig_data);
  local_530[0] = (class_property<bool>)!bVar3;
  peStack_528 = (element_type *)0x0;
  local_520.pi_ = (sp_counted_base *)0x0;
  local_658 = "!SignSignature(keystore, CTransaction(prev), curr, 0, SIGHASH_ALL, sig_data)";
  local_650 = "";
  local_510[8] = '\0';
  local_510._0_8_ = &PTR__lazy_ostream_011481f0;
  local_510._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_668 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_660 = "";
  piStack_4f8 = (int *)&local_658;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_530,(lazy_ostream *)local_510,1,0,WARN,_cVar6,
             (size_t)&local_668,0x501);
  boost::detail::shared_count::~shared_count(&local_520);
  CTransaction::~CTransaction((CTransaction *)local_5b8);
  std::
  vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ::~vector(&builder.m_branch);
  CMutableTransaction::~CMutableTransaction(&curr);
  CMutableTransaction::~CMutableTransaction(&prev);
  SignatureData::~SignatureData(&sig_data);
  FillableSigningProvider::~FillableSigningProvider(&keystore);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(sign_invalid_miniscript)
{
    FillableSigningProvider keystore;
    SignatureData sig_data;
    CMutableTransaction prev, curr;

    // Create a Taproot output which contains a leaf in which a non-32 bytes push is used where a public key is expected
    // by the Miniscript parser. This offending Script was found by the RPC fuzzer.
    const auto invalid_pubkey{"173d36c8c9c9c9ffffffffffff0200000000021e1e37373721361818181818181e1e1e1e19000000000000000000b19292929292926b006c9b9b9292"_hex_u8};
    TaprootBuilder builder;
    builder.Add(0, {invalid_pubkey}, 0xc0);
    builder.Finalize(XOnlyPubKey::NUMS_H);
    prev.vout.emplace_back(0, GetScriptForDestination(builder.GetOutput()));
    curr.vin.emplace_back(COutPoint{prev.GetHash(), 0});
    sig_data.tr_spenddata = builder.GetSpendData();

    // SignSignature can fail but it shouldn't raise an exception (nor crash).
    BOOST_CHECK(!SignSignature(keystore, CTransaction(prev), curr, 0, SIGHASH_ALL, sig_data));
}